

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  int iVar2;
  Node *pNVar3;
  global_State *pgVar4;
  uint uVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  int key;
  size_t sVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  iVar2 = t->sizearray;
  bVar1 = t->lsizenode;
  pNVar3 = t->node;
  if (iVar2 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar2) {
    t->sizearray = nasize;
    lVar9 = (long)nasize * 0x10 + 8;
    key = nasize + 1;
    do {
      pTVar7 = t->array;
      if (*(int *)((long)&pTVar7->value + lVar9) != 0) {
        pTVar6 = luaH_setnum(L,t,key);
        pTVar6->value = *(Value *)((long)pTVar7 + lVar9 + -8);
        pTVar6->tt = *(int *)((long)&pTVar7->value + lVar9);
      }
      lVar9 = lVar9 + 0x10;
      bVar11 = key != iVar2;
      key = key + 1;
    } while (bVar11);
    if (nasize < -1) {
      luaG_runerror(L,"memory allocation error: block too big");
    }
    pTVar7 = (TValue *)luaM_realloc_(L,t->array,(long)iVar2 << 4,(long)nasize * 0x10);
    t->array = pTVar7;
  }
  uVar5 = (int)(1L << (bVar1 & 0x3f)) - 1;
  if (-1 < (int)uVar5) {
    pTVar7 = (TValue *)&pNVar3[uVar5].i_key;
    lVar9 = (ulong)uVar5 + 1;
    do {
      if (pTVar7[-1].tt != 0) {
        pTVar6 = luaH_set(L,t,pTVar7);
        pTVar6->value = pTVar7[-1].value;
        pTVar6->tt = pTVar7[-1].tt;
      }
      pTVar7 = (TValue *)&pTVar7[-3].tt;
      lVar10 = lVar9 + -1;
      bVar11 = 0 < lVar9;
      lVar9 = lVar10;
    } while (lVar10 != 0 && bVar11);
  }
  if (pNVar3 != &dummynode_) {
    sVar8 = 0x28L << (bVar1 & 0x3f);
    pgVar4 = L->l_G;
    (*pgVar4->frealloc)(pgVar4->ud,pNVar3,sVar8,0);
    pgVar4->totalbytes = pgVar4->totalbytes - sVar8;
  }
  return;
}

Assistant:

static void resize(lua_State*L,Table*t,int nasize,int nhsize){
int i;
int oldasize=t->sizearray;
int oldhsize=t->lsizenode;
Node*nold=t->node;
if(nasize>oldasize)
setarrayvector(L,t,nasize);
setnodevector(L,t,nhsize);
if(nasize<oldasize){
t->sizearray=nasize;
for(i=nasize;i<oldasize;i++){
if(!ttisnil(&t->array[i]))
setobj(L,luaH_setnum(L,t,i+1),&t->array[i]);
}
luaM_reallocvector(L,t->array,oldasize,nasize,TValue);
}
for(i=twoto(oldhsize)-1;i>=0;i--){
Node*old=nold+i;
if(!ttisnil(gval(old)))
setobj(L,luaH_set(L,t,key2tval(old)),gval(old));
}
if(nold!=(&dummynode_))
luaM_freearray(L,nold,twoto(oldhsize),Node);
}